

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int little2_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  if (ptr == end) {
    return -1;
  }
  bVar1 = ptr[1];
  iVar5 = 0;
  pbVar4 = (byte *)ptr;
  if (bVar1 - 0xd8 < 4) {
LAB_0015875e:
    lVar7 = (long)end - (long)ptr;
joined_r0x00158765:
    iVar6 = iVar5;
    if (lVar7 < 4) {
      return -2;
    }
  }
  else {
    iVar6 = 0;
    if (bVar1 - 0xdc < 4) goto switchD_00158709_caseD_8;
    if (bVar1 == 0) {
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      if (cVar2 == '\x05') {
        lVar7 = (long)end - (long)ptr;
joined_r0x00158791:
        iVar6 = iVar5;
        if (lVar7 < 2) {
          return -2;
        }
        goto switchD_00158709_caseD_8;
      }
      if (cVar2 == '\x06') {
        lVar7 = (long)end - (long)ptr;
joined_r0x0015879c:
        iVar6 = iVar5;
        if (lVar7 < 3) {
          return -2;
        }
        goto switchD_00158709_caseD_8;
      }
      if (cVar2 == '\a') goto LAB_0015875e;
      if (cVar2 == '\x13') {
        pbVar4 = (byte *)(ptr + 2);
        if (pbVar4 == (byte *)end) {
          return -1;
        }
        if (ptr[3] == '\0') {
          if ((ulong)*pbVar4 == 0x78) {
            pbVar4 = (byte *)(ptr + 4);
            if (pbVar4 == (byte *)end) {
              return -1;
            }
            iVar6 = iVar5;
            if ((ptr[5] == '\0') &&
               ((*(byte *)((long)enc[1].scanners + (ulong)*pbVar4) & 0xfe) == 0x18)) {
              pbVar4 = (byte *)(ptr + 6);
              while( true ) {
                if (pbVar4 == (byte *)end) {
                  return -1;
                }
                if (pbVar4[1] != 0) goto switchD_00158709_caseD_8;
                bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar4);
                if (1 < bVar1 - 0x18) break;
                pbVar4 = pbVar4 + 2;
              }
              if (bVar1 == 0x12) {
                pbVar4 = pbVar4 + 2;
                iVar6 = 10;
              }
            }
          }
          else {
            iVar6 = iVar5;
            if (*(char *)((long)enc[1].scanners + (ulong)*pbVar4) == '\x19') {
              pbVar3 = (byte *)(ptr + 4);
              do {
                pbVar4 = pbVar3;
                if (pbVar4 == (byte *)end) {
                  return -1;
                }
                if (pbVar4[1] != 0) goto switchD_00158709_caseD_8;
                cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar4);
                pbVar3 = pbVar4 + 2;
              } while (cVar2 == '\x19');
              if (cVar2 == '\x12') {
                pbVar4 = pbVar4 + 2;
                iVar6 = 10;
              }
            }
          }
        }
        goto switchD_00158709_caseD_8;
      }
      if ((cVar2 == '\x16') || (cVar2 == '\x18')) goto LAB_00158655;
      iVar6 = iVar5;
      if (cVar2 != '\x1d') goto switchD_00158709_caseD_8;
    }
    else if ((bVar1 == 0xff) && (iVar6 = iVar5, 0xfd < (byte)*ptr)) goto switchD_00158709_caseD_8;
    iVar6 = iVar5;
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
         ((byte)*ptr & 0x1f) & 1) != 0) {
LAB_00158655:
      lVar7 = (long)end - (long)ptr;
      pbVar4 = (byte *)(ptr + 2);
      while( true ) {
        lVar7 = lVar7 + -2;
        if (pbVar4 == (byte *)end) {
          return -1;
        }
        bVar1 = pbVar4[1];
        if (bVar1 == 0) break;
        if (bVar1 == 0xff) {
          iVar6 = iVar5;
          if (0xfd < *pbVar4) goto switchD_00158709_caseD_8;
        }
        else {
          if (bVar1 - 0xd8 < 4) goto switchD_00158709_caseD_7;
          iVar6 = iVar5;
          if (bVar1 - 0xdc < 4) goto switchD_00158709_caseD_8;
        }
switchD_00158709_caseD_1d:
        iVar6 = iVar5;
        if ((*(uint *)((long)namingBitmap +
                      (ulong)(*pbVar4 >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5
                             )) >> (*pbVar4 & 0x1f) & 1) == 0) goto switchD_00158709_caseD_8;
switchD_00158709_caseD_16:
        pbVar4 = pbVar4 + 2;
      }
      iVar6 = iVar5;
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar4)) {
      case 5:
        goto joined_r0x00158791;
      case 6:
        goto joined_r0x0015879c;
      case 7:
switchD_00158709_caseD_7:
        goto joined_r0x00158765;
      default:
        break;
      case 0x12:
        pbVar4 = pbVar4 + 2;
        iVar6 = 9;
        break;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_00158709_caseD_16;
      case 0x1d:
        goto switchD_00158709_caseD_1d;
      }
    }
  }
switchD_00158709_caseD_8:
  *nextTokPtr = (char *)pbVar4;
  return iVar6;
}

Assistant:

static
int PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}